

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O3

void OPN2_FMPrepare(ym3438_t *chip)

{
  Bit32u BVar1;
  uint uVar2;
  Bit16u BVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  ushort uVar10;
  
  BVar1 = chip->cycles;
  uVar2 = chip->channel;
  uVar5 = BVar1 + ((BVar1 + 6) / 0x18) * -0x18 + 6;
  uVar4 = (ulong)chip->connect[uVar2];
  uVar9 = (ulong)((uVar5 * 0x2b >> 8 & 0xff) * 0xc0);
  if (*(int *)((long)fm_algorithm[0][0] + uVar4 * 4 + uVar9) == 0) {
    uVar8 = 0;
  }
  else {
    uVar8 = chip->fm_op1[uVar2][0];
  }
  if (*(int *)(uVar9 + 0x1ed5a0 + uVar4 * 4) == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = chip->fm_op1[uVar2][1];
  }
  iVar6 = BVar1 + ((BVar1 + 0x12) / 0x18) * -0x18;
  uVar7 = iVar6 + 0x12;
  if (*(int *)(uVar9 + 0x1ed5c0 + uVar4 * 4) != 0) {
    uVar10 = uVar10 | chip->fm_op2[uVar2];
  }
  if (*(int *)(uVar9 + 0x1ed5e0 + uVar4 * 4) != 0) {
    uVar8 = uVar8 | chip->fm_out[uVar7];
  }
  if (*(int *)(uVar9 + 0x1ed600 + uVar4 * 4) != 0) {
    uVar10 = uVar10 | chip->fm_out[uVar7];
  }
  if (uVar5 < 6) {
    BVar3 = 0;
    if (chip->fb[uVar2] != '\0') {
      BVar3 = (Bit16u)((int)(short)(uVar10 + uVar8) >> (10 - chip->fb[uVar2] & 0x1f));
    }
  }
  else {
    BVar3 = (Bit16u)((uint)(int)(short)(uVar10 + uVar8) >> 1);
  }
  chip->fm_mod[uVar5] = BVar3;
  if (uVar7 < 6) {
    chip->fm_op1[uVar2][1] = chip->fm_op1[uVar2][0];
    chip->fm_op1[uVar2][0] = chip->fm_out[uVar7];
  }
  else if (iVar6 + 6U < 6) {
    chip->fm_op2[uVar2] = chip->fm_out[uVar7];
  }
  return;
}

Assistant:

void OPN2_FMPrepare(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 6) % 24;
    Bit32u channel = chip->channel;
    Bit16s mod, mod1, mod2;
    Bit32u op = slot / 6;
    Bit8u connect = chip->connect[channel];
    Bit32u prevslot = (chip->cycles + 18) % 24;

    /* Calculate modulation */
    mod1 = mod2 = 0;

    if (fm_algorithm[op][0][connect])
    {
        mod2 |= chip->fm_op1[channel][0];
    }
    if (fm_algorithm[op][1][connect])
    {
        mod1 |= chip->fm_op1[channel][1];
    }
    if (fm_algorithm[op][2][connect])
    {
        mod1 |= chip->fm_op2[channel];
    }
    if (fm_algorithm[op][3][connect])
    {
        mod2 |= chip->fm_out[prevslot];
    }
    if (fm_algorithm[op][4][connect])
    {
        mod1 |= chip->fm_out[prevslot];
    }
    mod = mod1 + mod2;
    if (op == 0)
    {
        /* Feedback */
        mod = mod >> (10 - chip->fb[channel]);
        if (!chip->fb[channel])
        {
            mod = 0;
        }
    }
    else
    {
        mod >>= 1;
    }
    chip->fm_mod[slot] = mod;

    slot = (chip->cycles + 18) % 24;
    /* OP1 */
    if (slot / 6 == 0)
    {
        chip->fm_op1[channel][1] = chip->fm_op1[channel][0];
        chip->fm_op1[channel][0] = chip->fm_out[slot];
    }
    /* OP2 */
    if (slot / 6 == 2)
    {
        chip->fm_op2[channel] = chip->fm_out[slot];
    }
}